

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O0

int vpx_rac_get_prob_branchy(VpxRangeCoder *c,int prob)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint low_shift;
  uint low;
  unsigned_long code_word;
  int prob_local;
  VpxRangeCoder *c_local;
  
  uVar1 = vpx_rac_renorm(c);
  iVar2 = ((c->high + -1) * prob >> 8) + 1;
  bVar3 = uVar1 < (uint)(iVar2 * 0x10000);
  if (bVar3) {
    c->high = iVar2;
    c->code_word = uVar1;
  }
  else {
    c->high = c->high - iVar2;
    c->code_word = uVar1 + iVar2 * -0x10000;
  }
  c_local._4_4_ = (uint)!bVar3;
  return c_local._4_4_;
}

Assistant:

int vpx_rac_get_prob_branchy(VpxRangeCoder *c, int prob)
{
    unsigned long code_word = vpx_rac_renorm(c);
    unsigned low = 1 + (((c->high - 1) * prob) >> 8);
    unsigned low_shift = low << 16;

    if (code_word >= low_shift) {
        c->high     -= low;
        c->code_word = code_word - low_shift;
        return 1;
    }

    c->high = low;
    c->code_word = code_word;
    return 0;
}